

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

void yyerror(_GREG *G,char *message)

{
  char cVar1;
  int iVar2;
  
  fprintf(_stderr,"%s:%d: %s",fileName,(ulong)(uint)lineNumber,message);
  if (*G->text != '\0') {
    fprintf(_stderr," near token \'%s\'");
  }
  if ((G->pos < G->limit) || (iVar2 = feof((FILE *)input), iVar2 == 0)) {
    G->buf[G->limit] = '\0';
    fwrite(" before text \"",0xe,1,_stderr);
    while( true ) {
      iVar2 = G->pos;
      if (G->limit <= iVar2) break;
      cVar1 = G->buf[iVar2];
      if ((cVar1 == '\n') || (cVar1 == '\r')) break;
      G->pos = iVar2 + 1;
      fputc((int)G->buf[iVar2],_stderr);
    }
    if (iVar2 == G->limit) {
      while( true ) {
        iVar2 = fgetc((FILE *)input);
        if ((iVar2 + 1U < 0xf) && ((0x4801U >> (iVar2 + 1U & 0x1f) & 1) != 0)) break;
        fputc(iVar2,_stderr);
      }
    }
    fputc(0x22,_stderr);
  }
  fputc(10,_stderr);
  exit(1);
}

Assistant:

void yyerror(struct _GREG *G, const char *message)
{
  fprintf(stderr, "%s:%d: %s", fileName, lineNumber, message);
  if (G->text[0]) fprintf(stderr, " near token '%s'", G->text);
  if (G->pos < G->limit || !feof(input))
    {
      G->buf[G->limit]= '\0';
      fprintf(stderr, " before text \"");
      while (G->pos < G->limit)
	{
	  if ('\n' == G->buf[G->pos] || '\r' == G->buf[G->pos]) break;
	  fputc(G->buf[G->pos++], stderr);
	}
      if (G->pos == G->limit)
	{
	  int c;
	  while (EOF != (c= fgetc(input)) && '\n' != c && '\r' != c)
	    fputc(c, stderr);
	}
      fputc('\"', stderr);
    }
  fprintf(stderr, "\n");
  exit(1);
}